

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# users.h
# Opt level: O0

void __thiscall wasm::DataFlow::Users::stopUsingValues(Users *this,Node *node)

{
  bool bVar1;
  reference ppNVar2;
  UserSet *this_00;
  UserSet *users;
  Node *value;
  iterator __end2;
  iterator __begin2;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *__range2;
  Node *node_local;
  Users *this_local;
  
  __range2 = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)node;
  node_local = (Node *)this;
  __end2 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::begin
                     (&node->values);
  value = (Node *)std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::end
                            (&node->values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                                *)&value);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
              ::operator*(&__end2);
    this_00 = getUsers(this,*ppNVar2);
    std::
    unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
    ::erase(this_00,(key_type *)&__range2);
    __gnu_cxx::
    __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void stopUsingValues(Node* node) {
    for (auto* value : node->values) {
      auto& users = getUsers(value);
      users.erase(node);
    }
  }